

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbcDecrypt.c
# Opt level: O1

void decryptInPlace_cold_1(void)

{
  perror("Invalid state size cannot continue\n");
  exit(9);
}

Assistant:

void cbc256Decrypt(ThreefishKey_t* key,
                   const uint64_t* iv,
                   uint64_t* cipher_text,
                   const uint64_t num_blocks)
{
    pd3("cbc256Decrypt()\n");
    //allocate 1 block of storage to store the previous cipher text
    uint64_t prev_block_odd[SAFE_SLICE] = {0, 0, 0 ,0};
    //allocate 1 block of storage to store the previous cipher text 
    uint64_t prev_block_even[SAFE_SLICE] = {0, 0, 0 ,0};

    pd3("decrypting %lu blocks\n", num_blocks);
    //pBuff(32, (uint8_t*)iv);

    //run each block through the cipher (in decrypt mode)
    for(uint64_t block=0; block<(num_blocks*SAFE_SLICE); block+=SAFE_SLICE)
    {
        bool even = ((block/SAFE_SLICE)%2 == 0) ? true : false;

        if(even)
        {
            //save the previous cipher text block if it is even 
            prev_block_even[0] = cipher_text[block];
            prev_block_even[1] = cipher_text[block+1];
            prev_block_even[2] = cipher_text[block+2];
            prev_block_even[3] = cipher_text[block+3];
        }
        else
        {
            //save the previous cipher text block if it is odd
            prev_block_odd[0] = cipher_text[block];
            prev_block_odd[1] = cipher_text[block+1];
            prev_block_odd[2] = cipher_text[block+2];
            prev_block_odd[3] = cipher_text[block+3];
        }
        //decrypt the block
        threefishDecryptBlockWords(key, &cipher_text[block], &cipher_text[block]);

        if(block == 0) //If this is the first block xor it with the iv
        {
            cipher_text[0] ^= iv[0]; cipher_text[1] ^= iv[1];
            cipher_text[2] ^= iv[2]; cipher_text[3] ^= iv[3];
        }
        else
        {
            if(even)
            {
                pd3("even\n");
                cipher_text[block] ^= prev_block_odd[0];
                cipher_text[block+1] ^= prev_block_odd[1]; 
                cipher_text[block+2] ^= prev_block_odd[2];
                cipher_text[block+3] ^= prev_block_odd[3];
                pd3("xoring cipher text with: \n");
		        //pBuff(32, (uint8_t*)prev_block_odd);
            }
            else
            {
                pd3("odd\n");
                cipher_text[block] ^= prev_block_even[0];
                cipher_text[block+1] ^= prev_block_even[1]; 
                cipher_text[block+2] ^= prev_block_even[2];
                cipher_text[block+3] ^= prev_block_even[3];
                pd3("xoring cipher text with: \n");
                //pBuff(32, (uint8_t*)prev_block_even);
            }
        }
    }
}